

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

pair<glm::vec<2,_int,_(glm::qualifier)0>,_float>
vera::FindCandidate(Image *_image,ivec2 p0,ivec2 p1,ivec2 p2)

{
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar1;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar7;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar8;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar9;
  int iVar10;
  int iVar11;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar12;
  uint uVar13;
  anon_union_4_3_4e90da17_for_vec<2,_int,_(glm::qualifier)0>_3 aVar14;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar15;
  int iVar16;
  bool bVar17;
  long lVar18;
  int iVar19;
  ulong uVar20;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar21;
  uint uVar22;
  anon_union_4_3_4e90b0ec_for_vec<2,_int,_(glm::qualifier)0>_5 aVar23;
  bool bVar24;
  float fVar25;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float extraout_XMM0_Da_02;
  float fVar26;
  pair<glm::vec<2,_int,_(glm::qualifier)0>,_float> pVar27;
  float local_f0;
  int local_ec;
  long local_e8;
  uint local_d0;
  long local_c0;
  
  aVar21 = p2.field_1;
  aVar12 = p1.field_0;
  aVar14 = p0.field_0;
  aVar1.x = aVar14.x;
  if (aVar12.x < aVar14.x) {
    aVar1.x = aVar12.x;
  }
  aVar23 = p1.field_1;
  aVar15 = p0.field_1;
  aVar7.y = aVar15.y;
  if (aVar23.y < aVar15.y) {
    aVar7.y = aVar23.y;
  }
  aVar9 = p2.field_0;
  if (aVar9.x < aVar1.x) {
    aVar1.x = aVar9.x;
  }
  if (aVar21.y < aVar7.y) {
    aVar7.y = aVar21.y;
  }
  aVar2.x = aVar12.x;
  if (aVar14.x - aVar12.x != 0 && aVar12.x <= aVar14.x) {
    aVar2.x = aVar14.x;
  }
  aVar8.y = aVar23.y;
  if (aVar15.y - aVar23.y != 0 && aVar23.y <= aVar15.y) {
    aVar8.y = aVar15.y;
  }
  iVar16 = -(aVar15.y - aVar23.y);
  if (aVar2.x <= aVar9.x) {
    aVar2.x = aVar9.x;
  }
  if (aVar8.y <= aVar21.y) {
    aVar8.y = aVar21.y;
  }
  iVar11 = (aVar1.x - aVar12.x) * (aVar21.y - aVar7.y) + (aVar9.x - aVar1.x) * (aVar23.y - aVar7.y);
  iVar19 = (aVar1.x - aVar9.x) * (aVar15.y - aVar7.y) + (aVar14.x - aVar1.x) * (aVar21.y - aVar7.y);
  iVar10 = aVar15.y - aVar21.y;
  fVar25 = (float)((aVar23.y - aVar21.y) * (aVar9.x - aVar14.x) + iVar10 * (aVar12.x - aVar9.x));
  local_ec = (aVar1.x - aVar14.x) * (aVar23.y - aVar7.y) +
             (aVar12.x - aVar1.x) * (aVar15.y - aVar7.y);
  iVar3 = aVar21.y - aVar23.y;
  iVar4 = (*_image->_vptr_Image[0xe])(_image);
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var,iVar4));
  lVar18 = (long)aVar12.x;
  local_e8 = (long)p1 >> 0x20;
  iVar4 = (*_image->_vptr_Image[0xe])(_image,lVar18,local_e8);
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_00,iVar4));
  iVar4 = (*_image->_vptr_Image[0xe])();
  (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_01,iVar4));
  if (aVar9.x < lVar18) {
    lVar18 = (long)aVar9.x;
  }
  if (aVar14.x <= lVar18) {
    lVar18 = (long)aVar14.x;
  }
  if ((long)p0 >> 0x20 < local_e8) {
    local_e8 = (long)p0 >> 0x20;
  }
  if ((long)p2 >> 0x20 <= local_e8) {
    local_e8 = (long)p2 >> 0x20;
  }
  iVar4 = (int)local_e8;
  local_f0 = 0.0;
  local_c0 = 0;
  local_d0 = 0;
  do {
    uVar13 = 0;
    if ((iVar11 < 0 && (ulong)p2 >> 0x20 != (ulong)p1 >> 0x20) &&
       (uVar13 = -(iVar11 / iVar3), -1 < iVar11 / iVar3)) {
      uVar13 = 0;
    }
    uVar5 = uVar13;
    if ((iVar19 < 0 && (ulong)p0 >> 0x20 != (ulong)p2 >> 0x20) &&
       (uVar5 = -(iVar19 / iVar10),
       uVar13 != uVar5 && SBORROW4(uVar13,uVar5) == (int)(uVar13 + iVar19 / iVar10) < 0)) {
      uVar5 = uVar13;
    }
    uVar13 = uVar5;
    if ((local_ec < 0 && (ulong)p1 >> 0x20 != (ulong)p0 >> 0x20) &&
       (uVar13 = -(local_ec / iVar16),
       uVar5 != uVar13 && SBORROW4(uVar5,uVar13) == (int)(uVar5 + local_ec / iVar16) < 0)) {
      uVar13 = uVar5;
    }
    if ((int)(aVar1.x + uVar13) <= aVar2.x) {
      uVar22 = uVar13 * iVar16 + local_ec;
      uVar5 = uVar13 * iVar10 + iVar19;
      uVar20 = (ulong)uVar13;
      uVar13 = uVar13 * iVar3 + iVar11;
      bVar17 = false;
      do {
        bVar24 = (int)(uVar13 | uVar5 | uVar22) < 0;
        if (bVar24) {
          if (bVar17) break;
        }
        else {
          iVar6 = (*_image->_vptr_Image[0xe])(_image,lVar18 + uVar20,local_e8);
          (*_image->_vptr_Image[0x18])(_image,CONCAT44(extraout_var_02,iVar6));
          fVar26 = ABS(((float)(int)uVar22 * (extraout_XMM0_Da_01 / fVar25) +
                       (float)(int)uVar5 * (extraout_XMM0_Da_00 / fVar25) +
                       (float)(int)uVar13 * (extraout_XMM0_Da / fVar25)) - extraout_XMM0_Da_02);
          if (local_f0 < fVar26) {
            local_d0 = (int)lVar18 + (int)uVar20;
            local_c0 = local_e8;
            local_f0 = fVar26;
          }
        }
        uVar13 = uVar13 + iVar3;
        uVar5 = uVar5 + iVar10;
        uVar22 = uVar22 + iVar16;
        uVar20 = uVar20 + 1;
        bVar17 = !bVar24;
      } while ((aVar2.x - aVar1.x) + 1 != (int)uVar20);
    }
    iVar11 = iVar11 + (aVar12.x - aVar9.x);
    iVar19 = iVar19 + (aVar9.x - aVar14.x);
    local_ec = local_ec + (aVar14.x - aVar12.x);
    local_e8 = local_e8 + 1;
    if (((aVar8.y + iVar4) - aVar7.y) + 1 == (int)local_e8) {
      iVar16 = (int)local_c0;
      if ((((local_d0 == aVar14.x) && (iVar16 == aVar15.y)) ||
          ((local_d0 == aVar12.x && (iVar16 == aVar23.y)))) ||
         ((local_d0 == aVar9.x && (iVar16 == aVar21.y)))) {
        local_f0 = 0.0;
      }
      pVar27.first = (vec<2,_int,_(glm::qualifier)0>)((ulong)local_d0 | local_c0 << 0x20);
      pVar27.second = local_f0;
      return pVar27;
    }
  } while( true );
}

Assistant:

std::pair<glm::ivec2, float> FindCandidate( const Image& _image, const glm::ivec2 p0, const glm::ivec2 p1, const glm::ivec2 p2) { 
    
    const auto edge = []( const glm::ivec2 a, const glm::ivec2 b, const glm::ivec2 c) {
        return (b.x - c.x) * (a.y - c.y) - (b.y - c.y) * (a.x - c.x);
    };

    // triangle bounding box
    const glm::ivec2 min = glm::min(glm::min(p0, p1), p2);
    const glm::ivec2 max = glm::max(glm::max(p0, p1), p2);

    // forward differencing variables
    int w00 = edge(p1, p2, min);
    int w01 = edge(p2, p0, min);
    int w02 = edge(p0, p1, min);
    const int a01 = p1.y - p0.y;
    const int b01 = p0.x - p1.x;
    const int a12 = p2.y - p1.y;
    const int b12 = p1.x - p2.x;
    const int a20 = p0.y - p2.y;
    const int b20 = p2.x - p0.x;

    // pre-multiplied z values at vertices
    const float a = edge(p0, p1, p2);
    const float z0 = _image.getValue( _image.getIndex(p0.x, p0.y) ) / a;
    const float z1 = _image.getValue( _image.getIndex(p1.x, p1.y) ) / a;
    const float z2 = _image.getValue( _image.getIndex(p2.x, p2.y) ) / a;

    // iterate over pixels in bounding box
    float maxError = 0;
    glm::ivec2 maxPoint(0);
    for (int y = min.y; y <= max.y; y++) {
        // compute starting offset
        int dx = 0;
        if (w00 < 0 && a12 != 0)
            dx = std::max(dx, -w00 / a12);
        if (w01 < 0 && a20 != 0)
            dx = std::max(dx, -w01 / a20);
        if (w02 < 0 && a01 != 0)
            dx = std::max(dx, -w02 / a01);

        int w0 = w00 + a12 * dx;
        int w1 = w01 + a20 * dx;
        int w2 = w02 + a01 * dx;

        bool wasInside = false;

        for (int x = min.x + dx; x <= max.x; x++) {
            // check if inside triangle
            if (w0 >= 0 && w1 >= 0 && w2 >= 0) {
                wasInside = true;

                // compute z using barycentric coordinates
                const float z = z0 * w0 + z1 * w1 + z2 * w2;
                const float dz = std::abs(z - _image.getValue( _image.getIndex(x, y) ) );
                if (dz > maxError) {
                    maxError = dz;
                    maxPoint = glm::ivec2(x, y);
                }
            } else if (wasInside) {
                break;
            }

            w0 += a12;
            w1 += a20;
            w2 += a01;
        }

        w00 += b12;
        w01 += b20;
        w02 += b01;
    }

    if (maxPoint == p0 || maxPoint == p1 || maxPoint == p2) {
        maxError = 0;
    }

    return std::make_pair(maxPoint, maxError);
}